

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O2

void mpz_submul_ui(__mpz_struct *r,__mpz_struct *u,unsigned_long v)

{
  mpz_t t;
  __mpz_struct local_28;
  
  mpz_init_set_ui(&local_28,v);
  mpz_mul(&local_28,u,&local_28);
  mpz_sub(r,r,&local_28);
  if ((long)local_28._mp_alloc != 0) {
    (*gmp_free_func)(local_28._mp_d,(long)local_28._mp_alloc << 3);
    return;
  }
  return;
}

Assistant:

void
mpz_submul_ui (mpz_t r, const mpz_t u, unsigned long int v)
{
  mpz_t t;
  mpz_init_set_ui (t, v);
  mpz_mul (t, u, t);
  mpz_sub (r, r, t);
  mpz_clear (t);
}